

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmatrix.cpp
# Opt level: O3

VMatrix * __thiscall VMatrix::adjoint(VMatrix *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  VMatrix *in_RDI;
  
  fVar1 = this->m22;
  fVar2 = this->m23;
  fVar3 = this->mtx;
  fVar4 = this->mty;
  fVar5 = this->m33;
  fVar6 = this->m11;
  fVar7 = this->m12;
  fVar8 = this->m13;
  fVar9 = this->m21;
  in_RDI->m11 = fVar1 * fVar5 - fVar4 * fVar2;
  in_RDI->m12 = fVar8 * fVar4 - fVar5 * fVar7;
  in_RDI->m13 = fVar7 * fVar2 - fVar1 * fVar8;
  in_RDI->m21 = fVar2 * fVar3 - fVar5 * fVar9;
  in_RDI->m22 = fVar6 * fVar5 + fVar3 * -fVar8;
  in_RDI->m23 = fVar8 * fVar9 + fVar2 * -fVar6;
  in_RDI->mtx = fVar9 * fVar4 + fVar3 * -fVar1;
  in_RDI->mty = fVar7 * fVar3 + fVar4 * -fVar6;
  in_RDI->m33 = fVar1 * fVar6 + fVar9 * -fVar7;
  in_RDI->mType = None;
  in_RDI->dirty = Project;
  return in_RDI;
}

Assistant:

VMatrix VMatrix::adjoint() const
{
    float h11, h12, h13, h21, h22, h23, h31, h32, h33;
    h11 = m22 * m33 - m23 * mty;
    h21 = m23 * mtx - m21 * m33;
    h31 = m21 * mty - m22 * mtx;
    h12 = m13 * mty - m12 * m33;
    h22 = m11 * m33 - m13 * mtx;
    h32 = m12 * mtx - m11 * mty;
    h13 = m12 * m23 - m13 * m22;
    h23 = m13 * m21 - m11 * m23;
    h33 = m11 * m22 - m12 * m21;

    VMatrix res;
    res.m11 = h11;
    res.m12 = h12;
    res.m13 = h13;
    res.m21 = h21;
    res.m22 = h22;
    res.m23 = h23;
    res.mtx = h31;
    res.mty = h32;
    res.m33 = h33;
    res.mType = MatrixType::None;
    res.dirty = MatrixType::Project;

    return res;
}